

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

double Js::JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptLibrary *this;
  Var aValue_00;
  JavascriptBoolean *this_00;
  JavascriptTypedNumber<long> *this_01;
  long lVar7;
  JavascriptTypedNumber<unsigned_long> *this_02;
  unsigned_long uVar8;
  JavascriptString *this_03;
  undefined1 auVar9 [16];
  ScriptContext *local_50;
  BOOL fPrimitiveOnly;
  ScriptContext *objectScriptContext;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId;
  
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x353,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar2) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_50 = RecyclableObject::GetScriptContext(pRVar6);
  }
  else {
    local_50 = (ScriptContext *)0x0;
  }
  bVar2 = false;
  scriptContext_local = (ScriptContext *)aValue;
LAB_00f703a9:
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(scriptContext_local);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
      if (pRVar6 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar6);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_Null:
    aValue_local = (Var)0x0;
    break;
  case TypeIds_Boolean:
    this_00 = UnsafeVarTo<Js::JavascriptBoolean>(scriptContext_local);
    BVar4 = JavascriptBoolean::GetValue(this_00);
    aValue_local = (Var)(double)(BVar4 != 0);
    break;
  case TypeIds_FirstNumberType:
    aValue_local = (Var)TaggedInt::ToDouble(scriptContext_local);
    break;
  case TypeIds_Number:
    aValue_local = (Var)JavascriptNumber::GetValue(scriptContext_local);
    break;
  case TypeIds_Int64Number:
    this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
    lVar7 = JavascriptTypedNumber<long>::GetValue(this_01);
    aValue_local = (Var)(double)lVar7;
    break;
  case TypeIds_LastNumberType:
    this_02 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
    uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
    auVar9._8_4_ = (int)(uVar8 >> 0x20);
    auVar9._0_8_ = uVar8;
    auVar9._12_4_ = 0x45300000;
    aValue_local = (Var)((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
    break;
  case TypeIds_String:
    this_03 = UnsafeVarTo<Js::JavascriptString>(scriptContext_local);
    aValue_local = (Var)JavascriptString::ToDouble(this_03);
    break;
  case TypeIds_Symbol:
    JavascriptError::TryThrowTypeError(local_50,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
  case TypeIds_Undefined:
    this = ScriptContext::GetLibrary(scriptContext);
    aValue_00 = JavascriptLibraryBase::GetNaN(&this->super_JavascriptLibraryBase);
    aValue_local = (Var)JavascriptNumber::GetValue(aValue_00);
    break;
  default:
    goto LAB_00f706a7;
  }
  return (double)aValue_local;
LAB_00f706a7:
  BVar4 = Js::JavascriptOperators::IsObject(scriptContext_local);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x378,"(JavascriptOperators::IsObject(aValue))",
                                "bad type object in conversion ToInteger");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (bVar2) {
    JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
  }
  bVar2 = true;
  scriptContext_local =
       (ScriptContext *)ToPrimitive<(Js::JavascriptHint)2>(scriptContext_local,scriptContext);
  goto LAB_00f703a9;
}

Assistant:

double JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext* scriptContext)
    {
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return NaN if exceptions are disabled

            case TypeIds_Undefined:
                return JavascriptNumber::GetValue(scriptContext->GetLibrary()->GetNaN());

            case TypeIds_Null:
                return  0;

            case TypeIds_Integer:
                return TaggedInt::ToDouble(aValue);

            case TypeIds_Boolean:
                return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

            case TypeIds_Number:
                return JavascriptNumber::GetValue(aValue);

            case TypeIds_Int64Number:
                return (double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue();

            case TypeIds_UInt64Number:
                return (double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue();

            case TypeIds_String:
                return UnsafeVarTo<JavascriptString>(aValue)->ToDouble();

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger");
                    if(fPrimitiveOnly)
                    {
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }